

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_perftest.cc
# Opt level: O2

bool WriteFakeManifests(string *dir,string *err)

{
  int iVar1;
  TimeStamp TVar2;
  bool bVar3;
  string command;
  RealDiskInterface disk_interface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RealDiskInterface local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_48 = (RealDiskInterface)&PTR__FileReader_00129c68;
  std::operator+(&local_68,dir,"/build.ninja");
  TVar2 = RealDiskInterface::Stat(&local_48,&local_68,err);
  std::__cxx11::string::~string((string *)&local_68);
  if (TVar2 == 0) {
    std::operator+(&local_68,"python misc/write_fake_manifests.py ",dir);
    printf("Creating manifest data...");
    fflush(_stdout);
    iVar1 = system(local_68._M_dataplus._M_p);
    puts("done.");
    bVar3 = iVar1 == 0;
    if (!bVar3) {
      std::operator+(&local_40,"Failed to run ",&local_68);
      std::__cxx11::string::operator=((string *)err,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    bVar3 = TVar2 != -1;
  }
  return bVar3;
}

Assistant:

bool WriteFakeManifests(const string& dir, string* err) {
  RealDiskInterface disk_interface;
  TimeStamp mtime = disk_interface.Stat(dir + "/build.ninja", err);
  if (mtime != 0)  // 0 means that the file doesn't exist yet.
    return mtime != -1;

  string command = "python misc/write_fake_manifests.py " + dir;
  printf("Creating manifest data..."); fflush(stdout);
  int exit_code = system(command.c_str());
  printf("done.\n");
  if (exit_code != 0)
    *err = "Failed to run " + command;
  return exit_code == 0;
}